

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O3

void __thiscall
bloaty::RangeMapTest_UnknownSize2_Test::TestBody(RangeMapTest_UnknownSize2_Test *this)

{
  RangeMap *this_00;
  pointer pcVar1;
  uint64_t size;
  long lVar2;
  long *plVar3;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  allocator_type local_a9;
  undefined1 local_a8 [24];
  string local_90 [16];
  undefined1 local_80 [16];
  undefined8 local_70;
  undefined8 local_68;
  uint64_t local_60;
  long *local_58 [2];
  long local_48 [2];
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> local_38;
  
  size = (this->super_RangeMapTest).kUnknownSize;
  pcVar1 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"foo","");
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,100,size,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"bar","");
  RangeMap::AddRange(this_00,0x5f,10,(string *)local_a8);
  if ((pointer)local_a8._0_8_ != pcVar1) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._0_8_ = (pointer)0x5f;
  local_a8._8_8_ = 100;
  local_a8._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>(local_90,"bar","");
  local_70 = 100;
  local_68 = 0x69;
  local_60 = (this->super_RangeMapTest).kNoTranslation;
  plVar3 = local_48;
  local_58[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"foo","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_a8;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            (&local_38,__l,&local_a9);
  RangeMapTest::AssertMapEquals(&this->super_RangeMapTest,this_00,&local_38);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            (&local_38);
  lVar2 = -0x70;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -7;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0);
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize2) {
  // This case is slightly weird, but we do consider the "100" below to be a
  // hard fact even if the size is unknown, so the "[95, 105]: bar" range
  // doesn't override it.
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(95, 10, "bar");
  AssertMainMapEquals({
    {95, 100, kNoTranslation, "bar"},
    {100, 105, kNoTranslation, "foo"},
  });
}